

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O1

IntrinsicResult intrinsic_exists(Context *context,IntrinsicResult partialResult)

{
  long *plVar1;
  TextOutputMethod *pp_Var2;
  int iVar3;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *pDVar4;
  undefined4 *puVar5;
  TextOutputMethod __name;
  Value path;
  String pathStr;
  Value local_78;
  undefined1 local_68 [16];
  Interpreter *local_58;
  anon_union_8_3_2f476f46_for_data local_50;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *local_48;
  anon_union_8_3_2f476f46_for_data local_40;
  Value local_38 [2];
  
  local_40.tempNum._0_1_ = false;
  pDVar4 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)operator_new(0x30);
  (pDVar4->super_RefCountedStorage).refCount = 1;
  (pDVar4->super_RefCountedStorage)._vptr_RefCountedStorage =
       (_func_int **)&PTR__StringStorage_001d10b0;
  pDVar4->mTable[0] = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x5;
  pDVar4->mTable[1] = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0xffffffffffffffff;
  puVar5 = (undefined4 *)operator_new__(5);
  pDVar4->mSize = (long)puVar5;
  *(undefined1 *)(puVar5 + 1) = 0;
  *puVar5 = 0x68746170;
  local_48 = pDVar4;
  MiniScript::Context::GetVar
            ((Context *)local_68,(String *)partialResult.rs,(LocalOnlyMode)&local_48);
  if ((local_48 != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
     ((bool)local_40.tempNum._0_1_ == false)) {
    plVar1 = &(local_48->super_RefCountedStorage).refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(local_48->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
    local_48 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
  }
  if (local_68[0] == 0) {
    local_78.type = MiniScript::Value::null;
    local_78.noInvoke = DAT_001d3321._0_1_;
    local_78.localOnly = DAT_001d3321._1_1_;
    local_78.data.ref = DAT_001d3328;
    if ((Temp < MiniScript::Value::null) && (DAT_001d3328 != (RefCountedStorage *)0x0)) {
      DAT_001d3328->refCount = DAT_001d3328->refCount + 1;
    }
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    MiniScript::Value::operator=
              ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
               &local_78);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
    if ((Temp < local_78.type) && (local_78.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_78.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_78.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_78.data.number = 0.0;
    }
  }
  else {
    MiniScript::Value::ToString((Value *)&local_58,(Machine *)local_68);
    if (local_58 == (Interpreter *)0x0) {
      __name = (TextOutputMethod)0x1a780e;
    }
    else {
      __name = local_58->implicitOutput;
    }
    iVar3 = access((char *)__name,0);
    MiniScript::Value::Truth(local_38,iVar3 != -1);
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    MiniScript::Value::operator=
              ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
               local_38);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
    if ((Temp < local_38[0].type) &&
       ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_38[0].data.ref !=
        (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0)) {
      plVar1 = &(local_38[0].data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((RefCountedStorage *)&(local_38[0].data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
      }
      local_38[0].data.number = 0.0;
    }
    if ((local_58 != (Interpreter *)0x0) && (local_50.tempNum._0_1_ == '\0')) {
      pp_Var2 = &local_58->standardOutput;
      *pp_Var2 = *pp_Var2 + -1;
      if (*pp_Var2 == (TextOutputMethod)0x0) {
        (*local_58->_vptr_Interpreter[1])();
      }
      local_58 = (Interpreter *)0x0;
    }
  }
  if ((2 < local_68[0]) && ((long *)local_68._8_8_ != (long *)0x0)) {
    plVar1 = (long *)(local_68._8_8_ + 8);
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (**(code **)(*(long *)local_68._8_8_ + 8))();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_exists(Context *context, IntrinsicResult partialResult) {
	Value path = context->GetVar("path");
	if (path.IsNull()) return IntrinsicResult(Value::null);
	String pathStr = path.ToString();
	#if _WIN32 || _WIN64
		char pathBuf[512];
		_fullpath(pathBuf, pathStr.c_str(), sizeof(pathBuf));
		WIN32_FIND_DATA FindFileData;
		HANDLE handle = FindFirstFile(pathBuf, &FindFileData) ;
		bool found = handle != INVALID_HANDLE_VALUE;
		if (found) FindClose(handle);
	#else
		bool found = (access(pathStr.c_str(), F_OK ) != -1);
	#endif
	return IntrinsicResult(Value::Truth(found));
}